

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void * __thiscall vector<Node>::realloc(vector<Node> *this,void *__ptr,size_t __size)

{
  Node *pNVar1;
  uint uVar2;
  void *in_RAX;
  Node *__s;
  void *extraout_RAX;
  void *pvVar3;
  
  uVar2 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar2 = (uint)__ptr;
  }
  if (this->_capacity != uVar2) {
    __s = (Node *)operator_new__((ulong)uVar2 << 3);
    pvVar3 = (void *)0x0;
    memset(__s,0,(ulong)uVar2 << 3);
    pNVar1 = this->vect;
    in_RAX = (void *)(ulong)(uint)this->_size;
    if (this->_size < 1) {
      in_RAX = pvVar3;
    }
    for (; in_RAX != pvVar3; pvVar3 = (void *)((long)pvVar3 + 1)) {
      __s[(long)pvVar3] = pNVar1[(long)pvVar3];
    }
    this->_capacity = uVar2;
    if (pNVar1 != (Node *)0x0) {
      operator_delete__(pNVar1);
      in_RAX = extraout_RAX;
    }
    this->vect = __s;
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}